

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materialized_query_result.cpp
# Opt level: O3

Value * __thiscall
duckdb::MaterializedQueryResult::GetValue
          (Value *__return_storage_ptr__,MaterializedQueryResult *this,idx_t column,idx_t index)

{
  unique_ptr<duckdb::ColumnDataRowCollection,_std::default_delete<duckdb::ColumnDataRowCollection>,_true>
  *this_00;
  ColumnDataScanState *this_01;
  _Tuple_impl<0UL,_duckdb::ColumnDataRowCollection_*,_std::default_delete<duckdb::ColumnDataRowCollection>_>
  __ptr;
  pointer this_02;
  _Tuple_impl<0UL,_duckdb::ColumnDataRowCollection_*,_std::default_delete<duckdb::ColumnDataRowCollection>_>
  _Var1;
  pointer this_03;
  ColumnDataRowCollection local_e8;
  
  this_00 = &this->row_collection;
  if ((this->row_collection).
      super_unique_ptr<duckdb::ColumnDataRowCollection,_std::default_delete<duckdb::ColumnDataRowCollection>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::ColumnDataRowCollection,_std::default_delete<duckdb::ColumnDataRowCollection>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ColumnDataRowCollection_*,_std::default_delete<duckdb::ColumnDataRowCollection>_>
      .super__Head_base<0UL,_duckdb::ColumnDataRowCollection_*,_false>._M_head_impl ==
      (ColumnDataRowCollection *)0x0) {
    this_02 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
              ::operator->(&this->collection);
    ColumnDataCollection::GetRows(&local_e8,this_02);
    _Var1.super__Head_base<0UL,_duckdb::ColumnDataRowCollection_*,_false>._M_head_impl =
         (_Head_base<0UL,_duckdb::ColumnDataRowCollection_*,_false>)operator_new(0xb0);
    *(pointer *)_Var1.super__Head_base<0UL,_duckdb::ColumnDataRowCollection_*,_false>._M_head_impl =
         local_e8.rows.super_vector<duckdb::ColumnDataRow,_std::allocator<duckdb::ColumnDataRow>_>.
         super__Vector_base<duckdb::ColumnDataRow,_std::allocator<duckdb::ColumnDataRow>_>._M_impl.
         super__Vector_impl_data._M_start;
    *(pointer *)
     ((long)_Var1.super__Head_base<0UL,_duckdb::ColumnDataRowCollection_*,_false>._M_head_impl + 8)
         = local_e8.rows.super_vector<duckdb::ColumnDataRow,_std::allocator<duckdb::ColumnDataRow>_>
           .super__Vector_base<duckdb::ColumnDataRow,_std::allocator<duckdb::ColumnDataRow>_>.
           _M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)_Var1.super__Head_base<0UL,_duckdb::ColumnDataRowCollection_*,_false>._M_head_impl +
     0x10) = local_e8.rows.
             super_vector<duckdb::ColumnDataRow,_std::allocator<duckdb::ColumnDataRow>_>.
             super__Vector_base<duckdb::ColumnDataRow,_std::allocator<duckdb::ColumnDataRow>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_e8.rows.super_vector<duckdb::ColumnDataRow,_std::allocator<duckdb::ColumnDataRow>_>.
    super__Vector_base<duckdb::ColumnDataRow,_std::allocator<duckdb::ColumnDataRow>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_e8.rows.super_vector<duckdb::ColumnDataRow,_std::allocator<duckdb::ColumnDataRow>_>.
    super__Vector_base<duckdb::ColumnDataRow,_std::allocator<duckdb::ColumnDataRow>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.rows.super_vector<duckdb::ColumnDataRow,_std::allocator<duckdb::ColumnDataRow>_>.
    super__Vector_base<duckdb::ColumnDataRow,_std::allocator<duckdb::ColumnDataRow>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined4 *)
     ((long)_Var1.super__Head_base<0UL,_duckdb::ColumnDataRowCollection_*,_false>._M_head_impl +
     0x18) = local_e8.chunks.
             super_vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start._0_4_;
    *(undefined4 *)
     ((long)_Var1.super__Head_base<0UL,_duckdb::ColumnDataRowCollection_*,_false>._M_head_impl +
     0x1c) = local_e8.chunks.
             super_vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start._4_4_;
    *(undefined4 *)
     ((long)_Var1.super__Head_base<0UL,_duckdb::ColumnDataRowCollection_*,_false>._M_head_impl +
     0x20) = local_e8.chunks.
             super_vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish._0_4_;
    *(undefined4 *)
     ((long)_Var1.super__Head_base<0UL,_duckdb::ColumnDataRowCollection_*,_false>._M_head_impl +
     0x24) = local_e8.chunks.
             super_vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish._4_4_;
    *(pointer *)
     ((long)_Var1.super__Head_base<0UL,_duckdb::ColumnDataRowCollection_*,_false>._M_head_impl +
     0x28) = local_e8.chunks.
             super_vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_e8.chunks.
    super_vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_e8.chunks.
    super_vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.chunks.
    super_vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    this_01 = &local_e8.scan_state;
    ::std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)((long)_Var1.super__Head_base<0UL,_duckdb::ColumnDataRowCollection_*,_false>.
                           _M_head_impl + 0x30),this_01,this_01);
    *(ColumnDataScanProperties *)
     ((long)_Var1.super__Head_base<0UL,_duckdb::ColumnDataRowCollection_*,_false>._M_head_impl +
     0x68) = local_e8.scan_state.current_chunk_state.properties;
    *(idx_t *)((long)_Var1.super__Head_base<0UL,_duckdb::ColumnDataRowCollection_*,_false>.
                     _M_head_impl + 0x70) = local_e8.scan_state.segment_index;
    *(idx_t *)((long)_Var1.super__Head_base<0UL,_duckdb::ColumnDataRowCollection_*,_false>.
                     _M_head_impl + 0x78) = local_e8.scan_state.chunk_index;
    *(idx_t *)((long)_Var1.super__Head_base<0UL,_duckdb::ColumnDataRowCollection_*,_false>.
                     _M_head_impl + 0x80) = local_e8.scan_state.current_row_index;
    *(idx_t *)((long)_Var1.super__Head_base<0UL,_duckdb::ColumnDataRowCollection_*,_false>.
                     _M_head_impl + 0x88) = local_e8.scan_state.next_row_index;
    *(ColumnDataScanProperties *)
     ((long)_Var1.super__Head_base<0UL,_duckdb::ColumnDataRowCollection_*,_false>._M_head_impl +
     0x90) = local_e8.scan_state.properties;
    *(pointer *)
     ((long)_Var1.super__Head_base<0UL,_duckdb::ColumnDataRowCollection_*,_false>._M_head_impl +
     0x98) = local_e8.scan_state.column_ids.
             super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    *(pointer *)
     ((long)_Var1.super__Head_base<0UL,_duckdb::ColumnDataRowCollection_*,_false>._M_head_impl +
     0xa0) = local_e8.scan_state.column_ids.
             super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)_Var1.super__Head_base<0UL,_duckdb::ColumnDataRowCollection_*,_false>._M_head_impl +
     0xa8) = local_e8.scan_state.column_ids.
             super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    local_e8.scan_state.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_e8.scan_state.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.scan_state.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    __ptr.super__Head_base<0UL,_duckdb::ColumnDataRowCollection_*,_false>._M_head_impl =
         (this_00->
         super_unique_ptr<duckdb::ColumnDataRowCollection,_std::default_delete<duckdb::ColumnDataRowCollection>_>
         )._M_t.
         super___uniq_ptr_impl<duckdb::ColumnDataRowCollection,_std::default_delete<duckdb::ColumnDataRowCollection>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ColumnDataRowCollection_*,_std::default_delete<duckdb::ColumnDataRowCollection>_>
         .super__Head_base<0UL,_duckdb::ColumnDataRowCollection_*,_false>;
    (this_00->
    super_unique_ptr<duckdb::ColumnDataRowCollection,_std::default_delete<duckdb::ColumnDataRowCollection>_>
    )._M_t.
    super___uniq_ptr_impl<duckdb::ColumnDataRowCollection,_std::default_delete<duckdb::ColumnDataRowCollection>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::ColumnDataRowCollection_*,_std::default_delete<duckdb::ColumnDataRowCollection>_>
    .super__Head_base<0UL,_duckdb::ColumnDataRowCollection_*,_false> =
         _Var1.super__Head_base<0UL,_duckdb::ColumnDataRowCollection_*,_false>._M_head_impl;
    if ((__ptr.super__Head_base<0UL,_duckdb::ColumnDataRowCollection_*,_false>._M_head_impl !=
         (ColumnDataRowCollection *)0x0) &&
       (::std::default_delete<duckdb::ColumnDataRowCollection>::operator()
                  ((default_delete<duckdb::ColumnDataRowCollection> *)this_00,
                   (ColumnDataRowCollection *)
                   __ptr.super__Head_base<0UL,_duckdb::ColumnDataRowCollection_*,_false>.
                   _M_head_impl),
       local_e8.scan_state.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start != (pointer)0x0)) {
      operator_delete(local_e8.scan_state.column_ids.
                      super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    ::std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)this_01);
    ::std::
    vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
    ::~vector(&local_e8.chunks.
               super_vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
             );
    if (local_e8.rows.super_vector<duckdb::ColumnDataRow,_std::allocator<duckdb::ColumnDataRow>_>.
        super__Vector_base<duckdb::ColumnDataRow,_std::allocator<duckdb::ColumnDataRow>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_e8.rows.
                      super_vector<duckdb::ColumnDataRow,_std::allocator<duckdb::ColumnDataRow>_>.
                      super__Vector_base<duckdb::ColumnDataRow,_std::allocator<duckdb::ColumnDataRow>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  this_03 = unique_ptr<duckdb::ColumnDataRowCollection,_std::default_delete<duckdb::ColumnDataRowCollection>,_true>
            ::operator->(this_00);
  ColumnDataRowCollection::GetValue(__return_storage_ptr__,this_03,column,index);
  return __return_storage_ptr__;
}

Assistant:

Value MaterializedQueryResult::GetValue(idx_t column, idx_t index) {
	if (!row_collection) {
		row_collection = make_uniq<ColumnDataRowCollection>(collection->GetRows());
	}
	return row_collection->GetValue(column, index);
}